

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

void __thiscall Parsing::File::parseExt(File *this,string *s)

{
  long lVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  string local_48 [32];
  char *local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  string *local_18;
  string *s_local;
  File *this_local;
  
  local_18 = s;
  s_local = &this->_ext;
  lVar1 = std::__cxx11::string::find((char *)s,0x112150);
  if (lVar1 == -1) {
    std::__cxx11::string::clear();
  }
  local_20._M_current = (char *)std::__cxx11::string::begin();
  local_28 = (char *)std::__cxx11::string::end();
  std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (local_20,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_28);
  std::__cxx11::string::find_first_of((char *)s,0x112150);
  std::__cxx11::string::substr((ulong)local_48,(ulong)s);
  std::__cxx11::string::operator=((string *)s,local_48);
  std::__cxx11::string::~string(local_48);
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(__first,__last);
  std::__cxx11::string::operator=((string *)this,(string *)s);
  return;
}

Assistant:

void File::parseExt(std::string s)
    {
        if (s.find(".") == std::string::npos)
            _ext.clear();

        std::reverse(s.begin(), s.end());

        s = s.substr(0, s.find_first_of("."));
        std::reverse(s.begin(), s.end());
        _ext = s;
    }